

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O3

uint32_t hash(HTItemKey key,HTKeyType type)

{
  uint32_t uVar1;
  size_t length;
  ObjString *string;
  
  length = key.field_0.ident_length;
  string = (ObjString *)key.field_0.key_ident_string;
  switch(type) {
  case HT_KEY_OBJSTRING:
    uVar1 = hash_string_obj(string);
    return uVar1;
  case HT_KEY_CSTRING:
    length = strlen((char *)string);
    break;
  case HT_KEY_INT:
    uVar1 = hash_uint32_t(key.key_int);
    return uVar1;
  case HT_KEY_IDENT_STRING:
    break;
  default:
    return 0;
  }
  uVar1 = hash_string((char *)string,length);
  return uVar1;
}

Assistant:

uint32_t hash(HTItemKey key, HTKeyType type) {
    switch (type) {
        case HT_KEY_CSTRING:
            return hash_string(key.key_c_string, strlen(key.key_c_string));
        case HT_KEY_OBJSTRING:
            return hash_string_obj(key.key_obj_string);
        case HT_KEY_INT:
            return hash_uint32_t(key.key_int);
        case HT_KEY_IDENT_STRING:
            return hash_string(key.key_ident_string, key.ident_length);
    }

    return 0;
}